

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.cpp
# Opt level: O2

IssuePtr __thiscall libcellml::Logger::error(Logger *this,size_t index)

{
  vector<unsigned_long,_std::allocator<unsigned_long>_> *this_00;
  const_reference pvVar1;
  __shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  IssuePtr IVar3;
  
  this->_vptr_Logger = (_func_int **)0x0;
  this->mPimpl = (LoggerImpl *)0x0;
  this_00 = *(vector<unsigned_long,_std::allocator<unsigned_long>_> **)(index + 8);
  if (in_RDX._M_pi <
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
      ((long)(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this_00->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start >> 3)) {
    pvVar1 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                       (this_00,(size_type)in_RDX._M_pi);
    p_Var2 = &std::
              vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
              ::at((vector<std::shared_ptr<libcellml::Issue>,_std::allocator<std::shared_ptr<libcellml::Issue>_>_>
                    *)(this_00 + 3),*pvVar1)->
              super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
    std::__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2> *)this,p_Var2);
    in_RDX._M_pi = extraout_RDX;
  }
  IVar3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       in_RDX._M_pi;
  IVar3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (IssuePtr)IVar3.super___shared_ptr<libcellml::Issue,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

IssuePtr Logger::error(size_t index) const
{
    IssuePtr issue = nullptr;
    if (index < pFunc()->mErrors.size()) {
        issue = pFunc()->mIssues.at(pFunc()->mErrors.at(index));
    }
    return issue;
}